

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O1

_Bool fs_stdio_remove_entry(ALLEGRO_FS_ENTRY *fp)

{
  int iVar1;
  int *piVar2;
  
  if (((ulong)fp[2].vtable & 0x20) == 0) {
    iVar1 = 2;
    if (((ulong)fp[2].vtable & 0x10) == 0) goto LAB_0015ae37;
    iVar1 = unlink((char *)fp[1].vtable);
  }
  else {
    iVar1 = rmdir((char *)fp[1].vtable);
  }
  if (iVar1 == 0) {
    return true;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
LAB_0015ae37:
  al_set_errno(iVar1);
  return false;
}

Assistant:

static bool fs_stdio_remove_entry(ALLEGRO_FS_ENTRY *fp)
{
   ALLEGRO_FS_ENTRY_STDIO *fp_stdio = (ALLEGRO_FS_ENTRY_STDIO *) fp;
   int err;

   ASSERT(fp);

   if (fs_stdio_entry_mode(fp) & ALLEGRO_FILEMODE_ISDIR) {
      err = WRAP_RMDIR(fp_stdio->abs_path);
   }
   else if (fs_stdio_entry_mode(fp) & ALLEGRO_FILEMODE_ISFILE) {
      err = WRAP_UNLINK(fp_stdio->abs_path);
   }
   else {
      al_set_errno(ENOENT);
      return false;
   }

   if (err != 0) {
      al_set_errno(errno);
      return false;
   }

   return true;
}